

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

void __thiscall viface::VIface::VIface(VIface *this,string *name,bool tap,int id)

{
  _Head_base<0UL,_viface::VIfaceImpl_*,_false> this_00;
  string sStack_48;
  
  this_00._M_head_impl = (VIfaceImpl *)operator_new(0x168);
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  VIfaceImpl::VIfaceImpl(this_00._M_head_impl,&sStack_48,tap,id);
  (this->pimpl)._M_t.
  super___uniq_ptr_impl<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_>._M_t.
  super__Tuple_impl<0UL,_viface::VIfaceImpl_*,_std::default_delete<viface::VIfaceImpl>_>.
  super__Head_base<0UL,_viface::VIfaceImpl_*,_false>._M_head_impl = this_00._M_head_impl;
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

VIface::VIface(string name, bool tap, int id) :
    pimpl(new VIfaceImpl(name, tap, id))
{}